

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float32 commonNaNToFloat32(commonNaNT a,float_status *status)

{
  uint32_t mantissa;
  float_status *status_local;
  
  if (status->default_nan_mode == '\0') {
    if (a.high._4_4_ >> 9 == 0) {
      status_local._4_4_ = float32_default_nan_tricore(status);
    }
    else {
      status_local._4_4_ = (uint)a.sign << 0x1f | 0x7f800000 | a.high._4_4_ >> 9;
    }
  }
  else {
    status_local._4_4_ = float32_default_nan_tricore(status);
  }
  return status_local._4_4_;
}

Assistant:

static float32 commonNaNToFloat32(commonNaNT a, float_status *status)
{
    uint32_t mantissa = a.high >> 41;

    if (status->default_nan_mode) {
        return float32_default_nan(status);
    }

    if (mantissa) {
        return make_float32(
            (((uint32_t)a.sign) << 31) | 0x7F800000 | (a.high >> 41));
    } else {
        return float32_default_nan(status);
    }
}